

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOS65XXDisassembler.c
# Opt level: O0

void MOS65XX_printInst(MCInst *MI,SStream *O,void *PrinterInfo)

{
  byte bVar1;
  uint uVar2;
  SStream *in_RSI;
  long in_RDI;
  uint value;
  uchar opcode;
  char *in_stack_ffffffffffffffc8;
  OpInfo *pOVar3;
  
  bVar1 = *(byte *)(in_RDI + 8);
  pOVar3 = OpInfoTable;
  SStream_concat0((SStream *)OpInfoTable,in_stack_ffffffffffffffc8);
  uVar2 = *(uint *)(in_RDI + 0x18);
  switch(pOVar3[bVar1].am) {
  case MOS65XX_AM_IMP:
    break;
  case MOS65XX_AM_ACC:
    SStream_concat(in_RSI," a");
    break;
  case MOS65XX_AM_ABS:
    SStream_concat(in_RSI," $0x%04x",(ulong)uVar2);
    break;
  case MOS65XX_AM_ZP:
    SStream_concat(in_RSI," $0x%02x",(ulong)uVar2);
    break;
  case MOS65XX_AM_IMM:
    SStream_concat(in_RSI," #$0x%02x",(ulong)uVar2);
    break;
  case MOS65XX_AM_ABSX:
    SStream_concat(in_RSI," $0x%04x, x",(ulong)uVar2);
    break;
  case MOS65XX_AM_ABSY:
    SStream_concat(in_RSI," $0x%04x, y",(ulong)uVar2);
    break;
  case MOS65XX_AM_INDX:
    SStream_concat(in_RSI," ($0x%02x, x)",(ulong)uVar2);
    break;
  case MOS65XX_AM_INDY:
    SStream_concat(in_RSI," ($0x%02x), y",(ulong)uVar2);
    break;
  case MOS65XX_AM_ZPX:
    SStream_concat(in_RSI," $0x%02x, x",(ulong)uVar2);
    break;
  case MOS65XX_AM_ZPY:
    SStream_concat(in_RSI," $0x%02x, y",(ulong)uVar2);
    break;
  case MOS65XX_AM_REL:
    SStream_concat(in_RSI," $0x%04x",*(long *)(in_RDI + 0x318) + (long)(char)uVar2 + 2);
    break;
  case MOS65XX_AM_IND:
    SStream_concat(in_RSI," ($0x%04x)",(ulong)uVar2);
  }
  return;
}

Assistant:

void MOS65XX_printInst(MCInst *MI, struct SStream *O, void *PrinterInfo)
{
#ifndef CAPSTONE_DIET
	unsigned char opcode = MI->Opcode;

	SStream_concat0(O, InstructionInfoTable[OpInfoTable[MI->Opcode].ins].name);
	unsigned int value = MI->Operands[0].ImmVal;

	switch (OpInfoTable[opcode].am) {
		default:
			break;

		case MOS65XX_AM_IMP:
			break;

		case MOS65XX_AM_ACC:
			SStream_concat(O, " a");
			break;

		case MOS65XX_AM_ABS:
			SStream_concat(O, " $0x%04x", value);
			break;

		case MOS65XX_AM_IMM:
			SStream_concat(O, " #$0x%02x", value);
			break;

		case MOS65XX_AM_ZP:
			SStream_concat(O, " $0x%02x", value);
			break;

		case MOS65XX_AM_ABSX:
			SStream_concat(O, " $0x%04x, x", value);
			break;

		case MOS65XX_AM_ABSY:
			SStream_concat(O, " $0x%04x, y", value);
			break;

		case MOS65XX_AM_ZPX:
			SStream_concat(O, " $0x%02x, x", value);
			break;

		case MOS65XX_AM_ZPY:
			SStream_concat(O, " $0x%02x, y", value);
			break;

		case MOS65XX_AM_REL:
			SStream_concat(O, " $0x%04x", MI->address + (signed char) value + 2);
			break;

		case MOS65XX_AM_IND:
			SStream_concat(O, " ($0x%04x)", value);
			break;

		case MOS65XX_AM_INDX:
			SStream_concat(O, " ($0x%02x, x)", value);
			break;

		case MOS65XX_AM_INDY:
			SStream_concat(O, " ($0x%02x), y", value);
			break;
	}
#endif
}